

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<std::complex<double>_>::TPZFMatrix
          (TPZFMatrix<std::complex<double>_> *this,void **vtt,TPZFMatrix<std::complex<double>_> *A)

{
  ulong uVar1;
  int *piVar2;
  int64_t iVar3;
  complex<double> *pcVar4;
  char cVar5;
  int *piVar6;
  ulong uVar7;
  
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[2];
  iVar3 = (A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = iVar3;
  cVar5 = (A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = cVar5;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  pcVar4 = A->fGiven;
  this->fElem = A->fElem;
  this->fGiven = pcVar4;
  this->fSize = A->fSize;
  (this->fPivot).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  uVar1 = (A->fPivot).super_TPZVec<int>.fNElements;
  if ((long)uVar1 < 6) {
    piVar6 = (this->fPivot).fExtAlloc;
    (this->fPivot).super_TPZVec<int>.fStore = piVar6;
    (this->fPivot).super_TPZVec<int>.fNElements = uVar1;
    (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
    if ((long)uVar1 < 1) goto LAB_00beb437;
  }
  else {
    piVar6 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    (this->fPivot).super_TPZVec<int>.fStore = piVar6;
    (this->fPivot).super_TPZVec<int>.fNElements = uVar1;
    (this->fPivot).super_TPZVec<int>.fNAlloc = uVar1;
  }
  piVar2 = (A->fPivot).super_TPZVec<int>.fStore;
  uVar7 = 0;
  do {
    piVar6[uVar7] = piVar2[uVar7];
    uVar7 = uVar7 + 1;
  } while (uVar1 != uVar7);
LAB_00beb437:
  TPZVec<std::complex<double>_>::TPZVec(&this->fWork,&A->fWork);
  A->fElem = (complex<double> *)0x0;
  A->fGiven = (complex<double> *)0x0;
  A->fSize = 0;
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZFMatrix<TVar> &&A)
    : TPZMatrix<TVar>(A), fElem(A.fElem),
      fGiven(A.fGiven),fSize(A.fSize),
      fPivot(A.fPivot), fWork(A.fWork)
{
    A.fElem=nullptr;
    A.fGiven=nullptr;
    A.fSize=0;
}